

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  void *pvVar1;
  CURLcode local_34;
  CURLcode result;
  cf_hc_ctx *ctx;
  void *arg2_local;
  int arg1_local;
  int event_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  local_34 = CURLE_OK;
  if ((cf->field_0x24 & 1) == 0) {
    local_34 = cf_hc_baller_cntrl((cf_hc_baller *)((long)pvVar1 + 0x28),data,event,arg1,arg2);
    if ((local_34 == CURLE_OK) || (local_34 == CURLE_AGAIN)) {
      local_34 = cf_hc_baller_cntrl((cf_hc_baller *)((long)pvVar1 + 0x58),data,event,arg1,arg2);
    }
    if (local_34 == CURLE_AGAIN) {
      local_34 = CURLE_OK;
    }
  }
  return local_34;
}

Assistant:

static CURLcode cf_hc_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(!cf->connected) {
    result = cf_hc_baller_cntrl(&ctx->h3_baller, data, event, arg1, arg2);
    if(!result || (result == CURLE_AGAIN))
      result = cf_hc_baller_cntrl(&ctx->h21_baller, data, event, arg1, arg2);
    if(result == CURLE_AGAIN)
      result = CURLE_OK;
  }
  return result;
}